

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O2

QSize __thiscall QtMWidgets::Switch::sizeHint(Switch *this)

{
  int iVar1;
  int iVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  QSize QVar3;
  SwitchPrivate *this_00;
  QStyleOption opt;
  undefined1 local_50 [32];
  QRect r;
  
  QStyleOption::QStyleOption(&opt,1,0);
  QStyleOption::initFrom((QWidget *)&opt);
  iVar1 = QFontMetrics::ascent();
  this_00 = (this->d).d;
  this_00->radius = iVar1;
  iVar1 = 0;
  if ((this_00->offText).d.size == 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = QFontMetrics::boundingRect((QString *)local_50);
    iVar2 = (extraout_EDX - iVar2) + 1;
    this_00 = (this->d).d;
  }
  if ((this_00->onText).d.size != 0) {
    iVar1 = QFontMetrics::boundingRect((QString *)local_50);
    iVar1 = (extraout_EDX_00 - iVar1) + 1;
    this_00 = (this->d).d;
  }
  if (iVar1 < iVar2) {
    iVar1 = iVar2;
  }
  this_00->textWidth = iVar1;
  iVar2 = this_00->radius;
  iVar1 = iVar2 * 3 + iVar1;
  QVar3.wd = iVar2 / 2 + iVar1 + 2;
  r.x1 = 0;
  r.y1 = 0;
  r.x2 = iVar2 / 2 + iVar1 + 1;
  r.y2 = iVar2 * 2 + 1;
  SwitchPrivate::initOffset(this_00,&r);
  QStyleOption::~QStyleOption(&opt);
  QVar3.ht = iVar2 * 2 + 2;
  return QVar3;
}

Assistant:

QSize
Switch::sizeHint() const
{
	QStyleOption opt;
	opt.initFrom( this );

	d->radius = opt.fontMetrics.ascent();

	int offWidth = 0;
	int onWidth = 0;

	if( !d->offText.isEmpty() )
		offWidth = opt.fontMetrics.boundingRect( d->offText ).width();

	if( !d->onText.isEmpty() )
		onWidth = opt.fontMetrics.boundingRect( d->onText ).width();

	d->textWidth = qMax( offWidth, onWidth );

	const QRect r( 0, 0,
		d->textWidth + d->radius * 3 + d->radius / 2 + 2, d->radius * 2 + 2 );

	d->initOffset( r );

	return QSize( r.width(), r.height() );
}